

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O3

void __thiscall
mp::SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
HandleFeasibleSolution
          (SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          int status,CStringRef message,double *values,double *dual_values,double param_5)

{
  ulong uVar1;
  int iVar2;
  char *__s;
  StrictMockProblemBuilder *pSVar3;
  long *plVar4;
  TestSolver *pTVar5;
  Buffer<char> *pBVar6;
  Result RVar7;
  size_t size;
  size_t sVar8;
  char *str;
  size_t new_size;
  SolutionAdapter<StrictMockProblemBuilder> sol;
  MemoryWriter filename;
  SolutionAdapter<StrictMockProblemBuilder> local_2f0;
  BasicWriter<char> local_258;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> local_248;
  
  this->num_solutions_ = this->num_solutions_ + 1;
  __s = (this->solver_->super_Solver).super_BasicSolver.solution_stub_._M_dataplus._M_p;
  if (*__s == '\0') {
    return;
  }
  pSVar3 = this->builder_;
  plVar4 = (this->options_).data_;
  sVar8 = (this->options_).size_;
  if (values == (double *)0x0) {
    local_2f0.values_.size_ = 0;
  }
  else {
    RVar7 = MockProblemBuilder::num_vars
                      (&(pSVar3->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    local_2f0.values_.size_ = (size_t)RVar7;
  }
  if (dual_values == (double *)0x0) {
    local_2f0.dual_values_.size_ = 0;
  }
  else {
    RVar7 = MockProblemBuilder::num_algebraic_cons
                      (&(this->builder_->super_StrictMock<MockProblemBuilder>).
                        super_MockProblemBuilder);
    local_2f0.dual_values_.size_ = (size_t)RVar7;
  }
  pTVar5 = this->solver_;
  if (((pTVar5->super_Solver).super_BasicSolver.opts_read_ != true) ||
     (local_2f0.objno_ = 0, (pTVar5->super_Solver).super_BasicSolver.obj_added_ == true)) {
    iVar2 = (pTVar5->super_Solver).super_BasicSolver.objno_;
    local_2f0.objno_ = -iVar2;
    if (0 < iVar2) {
      local_2f0.objno_ = iVar2;
    }
  }
  local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00288528;
  local_248.super_Buffer<char>.size_ = 0;
  local_248.super_Buffer<char>.capacity_ = 500;
  local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00288570;
  local_2f0.status_ = status;
  local_2f0.builder_ = pSVar3;
  local_2f0.message_ = message.data_;
  local_2f0.options_.data_ = plVar4;
  local_2f0.options_.size_ = sVar8;
  local_2f0.values_.data_ = values;
  local_2f0.dual_values_.data_ = dual_values;
  local_258.buffer_ = &local_248.super_Buffer<char>;
  local_248.super_Buffer<char>.ptr_ = local_248.data_;
  size = strlen(__s);
  if (size < 0x1f5) {
    if (size == 0) goto LAB_001bfe95;
  }
  else {
    fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
  }
  memmove(local_248.super_Buffer<char>.ptr_ + local_248.super_Buffer<char>.size_,__s,size);
LAB_001bfe95:
  local_248.super_Buffer<char>.size_ = size;
  fmt::BasicWriter<char>::write_decimal<int>(&local_258,this->num_solutions_);
  pBVar6 = local_258.buffer_;
  sVar8 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  uVar1 = sVar8 + 4;
  if (((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_ < uVar1) {
    (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)(local_258.buffer_,uVar1);
    sVar8 = ((Buffer<char> *)&pBVar6->_vptr_Buffer)->size_;
  }
  builtin_strncpy(((Buffer<char> *)&pBVar6->_vptr_Buffer)->ptr_ + sVar8,".sol",4);
  ((Buffer<char> *)&pBVar6->_vptr_Buffer)->size_ = uVar1;
  sVar8 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  if (((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_ < sVar8 + 1) {
    (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)();
  }
  ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->ptr_[sVar8] = '\0';
  WriteSolFile<mp::SolutionAdapter<StrictMockProblemBuilder>>
            ((CStringRef)((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->ptr_,&local_2f0);
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00288528;
  local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00288570;
  if (local_248.super_Buffer<char>.ptr_ != local_248.data_) {
    operator_delete(local_248.super_Buffer<char>.ptr_,local_248.super_Buffer<char>.capacity_);
  }
  if (local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.dual_values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.dual_values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.values_.save_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.values_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.options_.save_.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::
HandleFeasibleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
  ++num_solutions_;
  const char *solution_stub = solver_.solution_stub();
  if (!*solution_stub)
    return;
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());
  fmt::MemoryWriter filename;
  filename << solution_stub << num_solutions_ << ".sol";
  this->Write(filename.c_str(), sol);
}